

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  size_t sVar4;
  FILE *pFVar5;
  FILE *__stream;
  char *local_288;
  option cmd_line_long_options [15];
  char *cmd_line_options;
  int cd_type;
  int ram_bank;
  int file;
  int opt;
  int j;
  int i;
  char cmd [80];
  char *local_30;
  char *p;
  FILE *ipl;
  FILE *fp;
  char **argv_local;
  int argc_local;
  
  cmd_line_long_options[0xe]._24_8_ = anon_var_dwarf_2db7;
  local_288 = "segment";
  cmd_line_long_options[0].name._0_4_ = 0;
  cmd_line_long_options[0].has_arg = 0;
  cmd_line_long_options[0]._12_4_ = 0;
  cmd_line_long_options[0].flag._0_4_ = 0x73;
  cmd_line_long_options[0]._24_8_ = anon_var_dwarf_2dcd;
  cmd_line_long_options[1].name._0_4_ = 0;
  cmd_line_long_options[1].has_arg = 0;
  cmd_line_long_options[1]._12_4_ = 0;
  cmd_line_long_options[1].flag._0_4_ = 0x53;
  cmd_line_long_options[1]._24_8_ = anon_var_dwarf_2de4;
  cmd_line_long_options[2].name._0_4_ = 1;
  cmd_line_long_options[2].has_arg = 0;
  cmd_line_long_options[2]._12_4_ = 0;
  cmd_line_long_options[2].flag._0_4_ = 0x6c;
  cmd_line_long_options[2]._24_8_ = anon_var_dwarf_2def;
  cmd_line_long_options[3].name._0_4_ = 0;
  cmd_line_long_options[3].has_arg = 0;
  cmd_line_long_options[3]._12_4_ = 0;
  cmd_line_long_options[3].flag._0_4_ = 0x6d;
  cmd_line_long_options[3]._24_8_ = anon_var_dwarf_2dfa;
  cmd_line_long_options[4].name._0_4_ = 0;
  cmd_line_long_options[4]._8_8_ = &header_opt;
  cmd_line_long_options[4].flag._0_4_ = 0;
  cmd_line_long_options[4]._24_8_ = (long)"scd" + 1;
  cmd_line_long_options[5].name._0_4_ = 0;
  cmd_line_long_options[5]._8_8_ = &cmd_line_options;
  cmd_line_long_options[5].flag._0_4_ = 1;
  cmd_line_long_options[5]._24_8_ = anon_var_dwarf_2e10;
  cmd_line_long_options[6].name._0_4_ = 0;
  cmd_line_long_options[6]._8_8_ = &cmd_line_options;
  cmd_line_long_options[6].flag._0_4_ = 2;
  cmd_line_long_options[6]._24_8_ = anon_var_dwarf_2e1b;
  cmd_line_long_options[7].name._0_4_ = 0;
  cmd_line_long_options[7]._8_8_ = &overlayflag;
  cmd_line_long_options[7].flag._0_4_ = 1;
  cmd_line_long_options[7]._24_8_ = anon_var_dwarf_2e26;
  cmd_line_long_options[8].name._0_4_ = 0;
  cmd_line_long_options[8]._8_8_ = &overlayflag;
  cmd_line_long_options[8].flag._0_4_ = 1;
  cmd_line_long_options[8]._24_8_ = anon_var_dwarf_2e31;
  cmd_line_long_options[9].name._0_4_ = 0;
  cmd_line_long_options[9]._8_8_ = &develo_opt;
  cmd_line_long_options[9].flag._0_4_ = 1;
  cmd_line_long_options[9]._24_8_ = anon_var_dwarf_2e3c;
  cmd_line_long_options[10].name._0_4_ = 0;
  cmd_line_long_options[10]._8_8_ = &develo_opt;
  cmd_line_long_options[10].flag._0_4_ = 1;
  cmd_line_long_options[10]._24_8_ = (long)".mx" + 1;
  cmd_line_long_options[0xb].name._0_4_ = 0;
  cmd_line_long_options[0xb]._8_8_ = &mx_opt;
  cmd_line_long_options[0xb].flag._0_4_ = 1;
  cmd_line_long_options[0xb]._24_8_ = anon_var_dwarf_2e52;
  cmd_line_long_options[0xc].name._0_4_ = 0;
  cmd_line_long_options[0xc]._8_8_ = &srec_opt;
  cmd_line_long_options[0xc].flag._0_4_ = 1;
  cmd_line_long_options[0xc]._24_8_ = anon_var_dwarf_2e5d;
  cmd_line_long_options[0xd].name._0_4_ = 0;
  cmd_line_long_options[0xd].has_arg = 0;
  cmd_line_long_options[0xd]._12_4_ = 0;
  cmd_line_long_options[0xd].flag._0_4_ = 0x68;
  memset(&cmd_line_long_options[0xd].val,0,0x20);
  atexit(cleanup);
  prg_name = strrchr(*argv,0x2f);
  if (prg_name == (char *)0x0) {
    pcVar2 = strrchr(*argv,0x5c);
    if (pcVar2 == (char *)0x0) {
      prg_name = *argv;
    }
    else {
      prg_name = pcVar2 + 1;
    }
  }
  else {
    prg_name = prg_name + 1;
  }
  pcVar2 = strrchr(prg_name,0x2e);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
  }
  iVar1 = strncasecmp(prg_name,"PCE",3);
  if (iVar1 == 0) {
    machine = &pce;
  }
  else {
    machine = &nes;
  }
  list_level = 2;
  header_opt = 1;
  overlayflag = 0;
  develo_opt = 0;
  mlist_opt = 0;
  srec_opt = 0;
  run_opt = 0;
  scd_opt = 0;
  cd_opt = 0;
  mx_opt = 0;
  cd_type = 0;
  cmd_line_options._0_4_ = 0;
  printf("%s\n\n",machine->asm_title);
  while (ram_bank = getopt_long_only(argc,argv,cmd_line_long_options[0xe]._24_8_,&local_288,&opt),
        pcVar2 = _optarg, 0 < ram_bank) {
    switch(ram_bank) {
    case 0x49:
      sVar4 = strlen(_optarg);
      iVar1 = add_path(pcVar2,(int)sVar4 + 1);
      if (iVar1 == 0) {
        printf("Error while adding include path\n");
        return 0;
      }
      break;
    default:
      return 1;
    case 0x53:
      dump_seg = 2;
      break;
    case 0x68:
      help();
      return 0;
    case 0x6c:
      lVar3 = atol(_optarg);
      list_level = (int)lVar3;
      if ((list_level < 0) || (3 < list_level)) {
        list_level = 2;
      }
      break;
    case 0x6d:
      mlist_opt = 1;
      break;
    case 0x73:
      dump_seg = 1;
    }
  }
  if (_optind == argc) {
    fprintf(_stderr,"Missing input file\n");
    return 0;
  }
  for (; _optind < argc; _optind = _optind + 1) {
    strcpy(in_fname,argv[_optind]);
    cd_type = cd_type + 1;
  }
  if ((int)cmd_line_options == 1) {
    cd_opt = 1;
    scd_opt = 0;
  }
  else if ((int)cmd_line_options == 2) {
    scd_opt = 2;
    cd_opt = 0;
  }
  if (((overlayflag == 1) && (scd_opt == 0)) && (cd_opt == 0)) {
    printf("Overlay option only valid for CD or SCD programs\n\n");
    help();
    return 0;
  }
  if (cd_type == 0) {
    help();
    return 0;
  }
  local_30 = strrchr(in_fname,0x2e);
  if (local_30 != (char *)0x0) {
    pcVar2 = strchr(local_30,0x2f);
    if (pcVar2 == (char *)0x0) {
      *local_30 = '\0';
    }
    else {
      local_30 = (char *)0x0;
    }
  }
  strcpy(out_fname,in_fname);
  strcpy(bin_fname,in_fname);
  strcpy(lst_fname,in_fname);
  strcpy(sym_fname,in_fname);
  strcat(lst_fname,".lst");
  strcat(sym_fname,".sym");
  if (overlayflag == 1) {
    strcat(bin_fname,".ovl");
  }
  else if ((cd_opt == 0) && (scd_opt == 0)) {
    strcat(bin_fname,machine->rom_ext);
  }
  else {
    strcat(bin_fname,".iso");
  }
  if (local_30 == (char *)0x0) {
    strcat(in_fname,".asm");
  }
  else {
    *local_30 = '.';
  }
  init_path();
  crc_init();
  iVar1 = open_input(in_fname);
  if (iVar1 != 0) {
    printf("Can not open input file \'%s\'!\n",in_fname);
    exit(1);
  }
  memset(rom,0xff,0x100000);
  memset(map,0xff,0x100000);
  for (opt = 0; opt < 0x100; opt = opt + 1) {
    hash_tbl[opt] = (t_symbol *)0x0;
    macro_tbl[opt] = (t_macro *)0x0;
    func_tbl[opt] = (t_func *)0x0;
    inst_tbl[opt] = (t_opcode *)0x0;
  }
  addinst(base_inst);
  addinst(base_pseudo);
  addinst(machine->inst);
  addinst(machine->pseudo_inst);
  lablset("MAGICKIT",1);
  lablset("DEVELO",develo_opt | mx_opt);
  lablset("CDROM",cd_opt | scd_opt);
  lablset("_bss_end",0);
  lablset("_bank_base",0);
  lablset("_nb_bank",1);
  lablset("_call_bank",0);
  max_zp = 1;
  max_bss = 0x201;
  max_bank = 0;
  rom_limit = 0x100000;
  bank_limit = 0x7f;
  bank_base = 0;
  errcnt = 0;
  if (cd_opt == 0) {
    if (scd_opt == 0) {
      if ((develo_opt != 0) || (mx_opt != 0)) {
        rom_limit = 0x30000;
        bank_limit = 0x17;
      }
    }
    else {
      rom_limit = 0x40000;
      bank_limit = 0x1f;
    }
  }
  else {
    rom_limit = 0x10000;
    bank_limit = 7;
  }
  pass = 0;
  do {
    if (1 < pass) {
      if (errcnt == 0) {
        if ((cd_opt == 0) && (scd_opt == 0)) {
          if ((develo_opt == 0) && (mx_opt == 0)) {
            if (srec_opt == 0) {
              pFVar5 = fopen(bin_fname,"wb");
              if (pFVar5 == (FILE *)0x0) {
                printf("Can not open binary file \'%s\'!\n",bin_fname);
                exit(1);
              }
              if (header_opt != 0) {
                (*machine->write_header)((FILE *)pFVar5,max_bank + 1);
              }
              fwrite(rom,0x2000,(long)(max_bank + 1),pFVar5);
              fclose(pFVar5);
            }
            else {
              write_srec(out_fname,"s28",0);
            }
          }
          else {
            page = (int)(uint)map[0][0] >> 5;
            if (page + max_bank < 7) {
              write_srec(out_fname,"mx",page << 0xd);
            }
            else {
              write_srec(out_fname,"mx",0xd0000);
            }
            if (develo_opt != 0) {
              sprintf((char *)&j,"perun %s",out_fname);
              system((char *)&j);
            }
          }
        }
        else {
          pFVar5 = fopen(bin_fname,"wb");
          if (pFVar5 == (FILE *)0x0) {
            printf("Can not open output file \'%s\'!\n",bin_fname);
            exit(1);
          }
          if ((header_opt != 0) && (overlayflag == 0)) {
            __stream = (FILE *)open_file("ipl.bin","rb");
            if (__stream == (FILE *)0x0) {
              printf("Can not find CD boot file \'ipl.bin\'!\n");
              exit(1);
            }
            fread(ipl_buffer,1,0x1000,__stream);
            fclose(__stream);
            memset(ipl_buffer + 0x800,0,0x20);
            ipl_buffer[0x802] = '\x02';
            ipl_buffer[0x803] = '\x10';
            ipl_buffer[0x804] = '\0';
            ipl_buffer[0x805] = '@';
            ipl_buffer[0x806] = 'p';
            ipl_buffer[0x807] = '@';
            ipl_buffer[0x808] = '\0';
            ipl_buffer[0x809] = '\x01';
            ipl_buffer[0x80a] = '\x02';
            ipl_buffer[0x80b] = '\x03';
            ipl_buffer[0x80c] = '\0';
            ipl_buffer[0x80d] = '`';
            fwrite(ipl_buffer,1,0x1000,pFVar5);
          }
          fwrite(rom,0x2000,(long)(max_bank + 1),pFVar5);
          if (overlayflag == 0) {
            memset(zeroes,0,0x800);
            zero_need = (max_bank + 1) * -4 + 0x1c0;
            if (zero_need < 0x96) {
              zero_need = 0x96;
            }
            for (; 0 < zero_need; zero_need = zero_need + -1) {
              fwrite(zeroes,1,0x800,pFVar5);
            }
          }
          fclose(pFVar5);
        }
      }
      if ((xlist != 0) && (list_level != 0)) {
        fclose((FILE *)lst_fp);
      }
      fclose((FILE *)in_fp);
      pFVar5 = fopen(sym_fname,"w");
      if (pFVar5 != (FILE *)0x0) {
        labldump((FILE *)pFVar5);
        fclose(pFVar5);
      }
      if (dump_seg != 0) {
        show_seg_usage();
      }
      return 0;
    }
    infile_error = -1;
    page = 7;
    bank = 0;
    loccnt = 0;
    slnum = 0;
    mcounter = 0;
    mcntmax = 0;
    xlist = 0;
    glablptr = (t_symbol *)0x0;
    skip_lines = 0;
    rsbase = 0;
    proc_nb = 0;
    asm_opt[0] = 0;
    asm_opt[1] = mlist_opt;
    asm_opt[2] = 0;
    asm_opt[3] = 0;
    for (opt = 0; opt < 4; opt = opt + 1) {
      for (file = 0; file < 0x100; file = file + 1) {
        bank_loccnt[opt][file] = 0;
        bank_glabl[opt][file] = (t_symbol *)0x0;
        bank_page[opt][file] = 0;
      }
    }
    cmd_line_options._4_4_ = machine->ram_bank;
    section = 2;
    section_bank[0] = cmd_line_options._4_4_;
    bank_page[0][(int)cmd_line_options._4_4_] = machine->ram_page;
    bank_loccnt[0][(int)cmd_line_options._4_4_] = 0;
    section_bank[1] = cmd_line_options._4_4_;
    bank_page[1][(int)cmd_line_options._4_4_] = machine->ram_page;
    bank_loccnt[1][(int)cmd_line_options._4_4_] = 0x200;
    section_bank[2] = 0;
    bank_page[2][0] = 7;
    bank_loccnt[2][0] = 0;
    section_bank[3] = 0;
    bank_page[3][0] = 7;
    bank_loccnt[3][0] = 0;
    printf("pass %i\n",(ulong)(pass + 1));
    do {
      iVar1 = readline();
      if (iVar1 == -1) break;
      assemble();
      if (0x2000 < loccnt) {
        loccnt = loccnt & 0x1fff;
        page = page + 1;
        bank = bank + 1;
        if (pass == 0) {
          printf("   (Warning. Opcode crossing page boundary $%04X, bank $%02X)\n",
                 (ulong)(uint)(page * 0x2000),(ulong)(uint)bank);
        }
      }
    } while (stop_pass == 0);
    if (pass == 0) {
      proc_reloc();
    }
    if (errcnt != 0) {
      printf("# %d error(s)\n",(ulong)(uint)errcnt);
      exit(1);
    }
    if (pass == 0) {
      bank_base = calc_bank_base();
    }
    if (pass == 0) {
      lablset("_bss_end",machine->ram_base + max_bss);
      lablset("_bank_base",bank_base);
      lablset("_call_bank",bank_base + max_bank + 1);
      lablset("_nb_bank",max_bank + 2);
    }
    if ((pass == 0) && ((((develo_opt != 0 || (mx_opt != 0)) || (cd_opt != 0)) || (scd_opt != 0))))
    {
      lablremap();
    }
    rewind((FILE *)in_fp);
    if (((pass == 0) && (xlist != 0)) && (list_level != 0)) {
      lst_fp = (FILE *)fopen(lst_fname,"w");
      if ((FILE *)lst_fp == (FILE *)0x0) {
        printf("Can not open listing file \'%s\'!\n",lst_fname);
        exit(1);
      }
      fprintf((FILE *)lst_fp,"#[1]   %s\n",0x123df8);
    }
    pass = pass + 1;
  } while( true );
}

Assistant:

int
main(int argc, char **argv)
{
	FILE *fp, *ipl;
	char *p;
	char  cmd[80];
	int i, j, opt;
	int file;
	int ram_bank;
	int cd_type;
	const char *cmd_line_options = "sSl:mhI:";
	const struct option cmd_line_long_options[] = {
		{"segment",     0, 0,		's'},
		{"fullsegment", 0, 0,		'S'},
		{"listing",	1, 0,		'l'},
		{"macro",       0, 0, 		'm'},
		{"raw",		0, &header_opt,  0 },
		{"cd",		0, &cd_type,	 1 },
		{"scd",		0, &cd_type,	 2 },
		{"over",	0, &overlayflag, 1 },
		{"overlay",	0, &overlayflag, 1 },
		{"dev",		0, &develo_opt,  1 },
		{"develo",	0, &develo_opt,  1 },			
		{"mx",		0, &mx_opt, 	 1 },
		{"srec",	0, &srec_opt, 	 1 },
		{"help",	0, 0,		'h'},
		{0,		0, 0,		 0 }
	};

	/* register atexit callback */
	atexit(cleanup);
	
	/* get program name */
	if ((prg_name = strrchr(argv[0], '/')) != NULL)
		 prg_name++;
	else {
		if ((prg_name = strrchr(argv[0], '\\')) == NULL)
			 prg_name = argv[0];
		else
			 prg_name++;
	}

	/* remove extension */
	if ((p = strrchr(prg_name, '.')) != NULL)
		*p = '\0';

	/* machine detection */
	if (!strncasecmp(prg_name, "PCE", 3))
		machine = &pce;     //change this to &nes to build NESASM
	else
		machine = &nes;

	/* init assembler options */
	list_level = 2;
	header_opt = 1;
	overlayflag = 0;
	develo_opt = 0;
	mlist_opt = 0;
	srec_opt = 0;
	run_opt = 0;
	scd_opt = 0;
	cd_opt = 0;
	mx_opt = 0;
	file = 0;
	cd_type = 0;
	
	/* display assembler version message */
	printf("%s\n\n", machine->asm_title);
	
	while ((opt = getopt_long_only (argc, argv, cmd_line_options, cmd_line_long_options, &i)) > 0)
	{
		switch(opt)
		{	
			case 's':
				dump_seg = 1;
				break;
				
			case 'S':
				dump_seg = 2;
				break;
			
			case 'l':
				/* get level */
				list_level = atol(optarg);
				
				/* check range */
				if (list_level < 0 || list_level > 3)
					list_level = 2;
				break;
			
			case 'm':
				mlist_opt = 1;
				break;
				
			case 'I':
				if(!add_path(optarg, strlen(optarg)+1))
				{
					printf("Error while adding include path\n");
					return 0;
				}
				break;
				
			case 'h':
				help();
				return 0;
				
			default:
				return 1;
		}		
	}

	/* check for missing asm file */
	if(optind == argc)
	{
		fprintf(stderr, "Missing input file\n");
		return 0;
	}
	
	/* get file names */
	for ( ; optind < argc; ++optind, ++file) {
		strcpy(in_fname, argv[optind]);
	}

	/* Adjust cdrom type values ... */
	switch(cd_type) {
		case 1:
			/* cdrom */	
			cd_opt  = STANDARD_CD;
			scd_opt = 0;
			break;
			
		case 2:
			/* super cdrom */
			scd_opt = SUPER_CD;
			cd_opt  = 0;
			break;
	}

	if ( (overlayflag == 1) &&
	     ((scd_opt == 0) && (cd_opt == 0)) )
	{
		printf("Overlay option only valid for CD or SCD programs\n\n");
		help();
		return (0);
	}

	if (!file) {
		help();
		return (0);
	}

	/* search file extension */
	if ((p = strrchr(in_fname, '.')) != NULL) {
		if (!strchr(p, PATH_SEPARATOR))
		   *p = '\0';
		else
			p = NULL;
	}

	/* auto-add file extensions */
	strcpy(out_fname, in_fname);
	strcpy(bin_fname, in_fname);
	strcpy(lst_fname, in_fname);
	strcpy(sym_fname, in_fname);
	strcat(lst_fname, ".lst");
	strcat(sym_fname, ".sym");

	if (overlayflag == 1)
		strcat(bin_fname, ".ovl");
	else if (cd_opt || scd_opt)
		strcat(bin_fname, ".iso");
	else
		strcat(bin_fname, machine->rom_ext);

	if (p)
	   *p = '.';
	else
		strcat(in_fname, ".asm");

	/* init include path */
	init_path();

	/* init crc functions */
	crc_init();

	/* open the input file */
	if (open_input(in_fname)) {
		printf("Can not open input file '%s'!\n", in_fname);
		exit(1);
	}

	/* clear the ROM array */
	memset(rom, 0xFF, 8192 * 128);
	memset(map, 0xFF, 8192 * 128);

	/* clear symbol hash tables */
	for (i = 0; i < 256; i++) {
		hash_tbl[i]  = NULL;
		macro_tbl[i] = NULL;
		func_tbl[i]  = NULL;
		inst_tbl[i]  = NULL;
	}

	/* fill the instruction hash table */
	addinst(base_inst);
	addinst(base_pseudo);

	/* add machine specific instructions and pseudos */
	addinst(machine->inst);
	addinst(machine->pseudo_inst);

	/* predefined symbols */
	lablset("MAGICKIT", 1);
	lablset("DEVELO", develo_opt | mx_opt);
	lablset("CDROM", cd_opt | scd_opt);
	lablset("_bss_end", 0);
	lablset("_bank_base", 0);
	lablset("_nb_bank", 1);
	lablset("_call_bank", 0);

	/* init global variables */
	max_zp = 0x01;
	max_bss = 0x0201;
	max_bank = 0;
	rom_limit = 0x100000;		/* 1MB */
	bank_limit = 0x7F;
	bank_base = 0;
	errcnt = 0;

	if (cd_opt) {
		rom_limit  = 0x10000;	/* 64KB */
		bank_limit = 0x07;
	}
	else if (scd_opt) {
		rom_limit  = 0x40000;	/* 256KB */
		bank_limit = 0x1F;
	}
	else if (develo_opt || mx_opt) {
		rom_limit  = 0x30000;	/* 192KB */
		bank_limit = 0x17;
	}

	/* assemble */
	for (pass = FIRST_PASS; pass <= LAST_PASS; pass++) {
		infile_error = -1;
		page = 7;
		bank = 0;
		loccnt = 0;
		slnum = 0;
		mcounter = 0;
		mcntmax = 0;
		xlist = 0;
		glablptr = NULL;
		skip_lines = 0;
		rsbase = 0;
		proc_nb = 0;

		/* reset assembler options */
		asm_opt[OPT_LIST] = 0;
		asm_opt[OPT_MACRO] = mlist_opt;
		asm_opt[OPT_WARNING] = 0;
		asm_opt[OPT_OPTIMIZE] = 0;

		/* reset bank arrays */
		for (i = 0; i < 4; i++) {
			for (j = 0; j < 256; j++) {
				bank_loccnt[i][j] = 0;
				bank_glabl[i][j]  = NULL;
				bank_page[i][j]   = 0;
			}
		}

		/* reset sections */
		ram_bank = machine->ram_bank;
		section  = S_CODE;

		/* .zp */
		section_bank[S_ZP]           = ram_bank;
		bank_page[S_ZP][ram_bank]    = machine->ram_page;
		bank_loccnt[S_ZP][ram_bank]  = 0x0000;

		/* .bss */
		section_bank[S_BSS]          = ram_bank;
		bank_page[S_BSS][ram_bank]   = machine->ram_page;
		bank_loccnt[S_BSS][ram_bank] = 0x0200;

		/* .code */
		section_bank[S_CODE]         = 0x00;
		bank_page[S_CODE][0x00]      = 0x07;
		bank_loccnt[S_CODE][0x00]    = 0x0000;

		/* .data */
		section_bank[S_DATA]         = 0x00;
		bank_page[S_DATA][0x00]      = 0x07;
		bank_loccnt[S_DATA][0x00]    = 0x0000;

		/* pass message */
		printf("pass %i\n", pass + 1);

		/* assemble */
		while (readline() != -1) {
			assemble();
			if (loccnt > 0x2000) {
				loccnt&=0x1fff;
				page++;
				bank++;
				if(pass==FIRST_PASS)
				printf("   (Warning. Opcode crossing page boundary $%04X, bank $%02X)\n",(page*0x2000),bank);
			}
			if (stop_pass)
				break;
		}

		/* relocate procs */
		if (pass == FIRST_PASS)
			proc_reloc();

		/* abord pass on errors */
		if (errcnt) {
			printf("# %d error(s)\n", errcnt);
			exit(1);
			//break;
		}

		/* adjust bank base */
		if (pass == FIRST_PASS)
			bank_base = calc_bank_base();

		/* update predefined symbols */
		if (pass == FIRST_PASS) {
			lablset("_bss_end", machine->ram_base + max_bss);
			lablset("_bank_base", bank_base);
			lablset("_call_bank", bank_base + max_bank + 1);
			lablset("_nb_bank", max_bank + 2);
		}

		/* adjust the symbol table for the develo or for cd-roms */
		if (pass == FIRST_PASS) {
			if (develo_opt || mx_opt || cd_opt || scd_opt)
				lablremap();
		}

		/* rewind input file */
		rewind(in_fp);

		/* open the listing file */
		if (pass == FIRST_PASS) {
			if (xlist && list_level) {
				if ((lst_fp = fopen(lst_fname, "w")) == NULL) {
					printf("Can not open listing file '%s'!\n", lst_fname);
					exit(1);
				}
				fprintf(lst_fp, "#[1]   %s\n", input_file[1].name);
			}
		}
	}

	/* rom */
	if (errcnt == 0) {
		/* cd-rom */
		if (cd_opt || scd_opt) {
			/* open output file */
			if ((fp = fopen(bin_fname, "wb")) == NULL) {
				printf("Can not open output file '%s'!\n", bin_fname);
				exit(1);
			}

			/* boot code */
			if ((header_opt) && (overlayflag == 0)) {
				/* open ipl binary file */
				if ((ipl = open_file("ipl.bin", "rb")) == NULL) {
					printf("Can not find CD boot file 'ipl.bin'!\n");
					exit(1);
				}

				/* load ipl */
				fread(ipl_buffer, 1, 4096, ipl);
				fclose(ipl);

				memset(&ipl_buffer[0x800], 0, 32);
				/* prg sector base */
				ipl_buffer[0x802] = 2;
				/* nb sectors */
				ipl_buffer[0x803] = 16;
				/* loading address */
				ipl_buffer[0x804] = 0x00;
				ipl_buffer[0x805] = 0x40;
				/* starting address */
				ipl_buffer[0x806] = BOOT_ENTRY_POINT & 0xFF;
				ipl_buffer[0x807] = (BOOT_ENTRY_POINT >> 8) & 0xFF;
				/* mpr registers */
				ipl_buffer[0x808] = 0x00;
				ipl_buffer[0x809] = 0x01;
				ipl_buffer[0x80A] = 0x02;
				ipl_buffer[0x80B] = 0x03;
				ipl_buffer[0x80C] = 0x00;	/* boot loader @ $C000 */
				/* load mode */
				ipl_buffer[0x80D] = 0x60;

				/* write boot code */
				fwrite(ipl_buffer, 1, 4096, fp);
			}

			/* write rom */
			fwrite(rom, 8192, (max_bank + 1), fp);

			/* write trailing zeroes to fill */
			/* at least 4 seconds of CDROM */
			if (overlayflag == 0)
			{
				memset(zeroes, 0, 2048);

				/* calculate number of trailing zero sectors      */
				/* rule 1: track must be at least 6 seconds total */
				zero_need = (6*75) - 2 - (4 * (max_bank + 1));

				/* rule 2: track should have at least 2 seconds     */
				/*         of trailing zeroes before an audio track */
				if (zero_need < (2*75))
					zero_need = (2*75);

				while (zero_need > 0) {
					fwrite(zeroes, 1, 2048, fp);
					zero_need--;
				}
			}

			fclose(fp);
		}

		/* develo box */
		else if (develo_opt || mx_opt) {
			page = (map[0][0] >> 5);

			/* save mx file */
			if ((page + max_bank) < 7)
				/* old format */
				write_srec(out_fname, "mx", page << 13);
			else
				/* new format */
				write_srec(out_fname, "mx", 0xD0000);

			/* execute */
			if (develo_opt) {
				sprintf(cmd, "perun %s", out_fname);
				system(cmd);
			}
		}

		/* save */
		else {
			/* s-record file */
			if (srec_opt)
				write_srec(out_fname, "s28", 0);

			/* binary file */
			else {
				/* open file */
				if ((fp = fopen(bin_fname, "wb")) == NULL) {
					printf("Can not open binary file '%s'!\n", bin_fname);
					exit(1);
				}

				/* write header */
				if (header_opt)
					machine->write_header(fp, max_bank + 1);

				/* write rom */
				fwrite(rom, 8192, (max_bank + 1), fp);
				fclose(fp);
			}
		}
	}

	/* close listing file */
	if (xlist && list_level)
		fclose(lst_fp);

	/* close input file */
	fclose(in_fp);

	/* dump the symbol table */
	if ((fp = fopen(sym_fname, "w")) != NULL) {
		labldump(fp);
		fclose(fp);
	}

	/* dump the bank table */
	if (dump_seg)
		show_seg_usage();

	/* ok */
	return(0);
}